

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::anon_unknown_1::AssertionPrinter::printOriginalExpression(AssertionPrinter *this)

{
  ostream *poVar1;
  string local_30;
  
  if ((this->result->m_info).capturedExpression.m_size != 0) {
    local_30._M_dataplus._M_p._0_1_ = 0x20;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(this->stream,(char *)&local_30,1);
    AssertionResult::getExpression_abi_cxx11_(&local_30,this->result);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(char *)CONCAT71(local_30._M_dataplus._M_p._1_7_,
                                       local_30._M_dataplus._M_p._0_1_),local_30._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_30._M_dataplus._M_p._1_7_,local_30._M_dataplus._M_p._0_1_) !=
        &local_30.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_30._M_dataplus._M_p._1_7_,local_30._M_dataplus._M_p._0_1_));
    }
  }
  return;
}

Assistant:

void printOriginalExpression() const {
        if (result.hasExpression()) {
            stream << ' ' << result.getExpression();
        }
    }